

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_98(QPDF *pdf,char *arg2)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  Pl_Buffer bf1;
  Pl_Buffer bf2;
  QPDFObjectHandle oh;
  long *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  long local_e8 [2];
  QPDF *local_d8;
  long *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  long local_c0 [2];
  QPDFObjectHandle local_b0;
  long local_a0 [5];
  long *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_68 [5];
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar3 = 1;
  local_d8 = pdf;
  while( true ) {
    iVar2 = (int)local_40;
    QPDF::getObject(iVar2,(int)local_d8);
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)&local_b0,"write",(Pipeline *)0x0);
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)&local_78,"get",(Pipeline *)0x0);
    QPDFObjectHandle::writeJSON(iVar2,(Pipeline *)0x2,SUB81((Pl_Buffer *)&local_b0,0),1);
    Pl_Buffer::finish();
    QPDFObjectHandle::getJSON((int)(Pipeline *)&local_f8,SUB81(local_40,0));
    JSON::write((Pipeline *)&local_f8,(ulong)&local_78);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    Pl_Buffer::finish();
    Pl_Buffer::getString_abi_cxx11_();
    Pl_Buffer::getString_abi_cxx11_();
    plVar1 = local_d0;
    if (local_f0 != local_c8) break;
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = bcmp(local_f8,local_d0,(size_t)local_f0);
      if (iVar2 != 0) break;
    }
    if (plVar1 != local_c0) {
      operator_delete(plVar1,local_c0[0] + 1);
    }
    if (local_f8 != local_e8) {
      operator_delete(local_f8,local_e8[0] + 1);
    }
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&local_78);
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&local_b0);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    iVar3 = iVar3 + 1;
    if (iVar3 == 7) {
      QPDF::getObject((int)&local_f8,(int)local_d8);
      QPDFObjectHandle::getDict();
      local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Test","");
      operator____qpdf((char *)&local_d0,0x14932c);
      QPDFObjectHandle::replaceKey((string *)&local_78,&local_b0);
      if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
      }
      if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_a0) {
        operator_delete(local_b0.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_a0[0] + 1);
      }
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
      }
      QPDF::getObject((int)&local_d0,(int)local_d8);
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      QPDFObjectHandle::getStreamJSON
                ((int)&local_f8,(qpdf_json_stream_data_e)&local_d0,qpdf_dl_specialized,
                 (Pipeline *)0x1,(string *)0x1);
      JSON::unparse_abi_cxx11_();
      iVar3 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar3 == 0) {
        if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)local_a0) {
          operator_delete(local_b0.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_a0[0] + 1);
        }
        if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
        }
        return;
      }
      __assert_fail("pdf.getObject(4, 0) .getStreamJSON(JSON::LATEST, qpdf_sj_inline, qpdf_dl_generalized, nullptr, \"\") .unparse() == \"{\\n\" \"  \\\"data\\\": \\\"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\\\",\\n\" \"  \\\"dict\\\": {\\n\" \"    \\\"/Test\\\": 42\\n\" \"  }\\n\" \"}\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd90,"void test_98(QPDF &, const char *)");
    }
  }
  __assert_fail("bf1.getString() == bf2.getString()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xd82,"void test_98(QPDF &, const char *)");
}

Assistant:

static void
test_98(QPDF& pdf, char const* arg2)
{
    // Test methods no longer used by qpdf as a result of QPDFObjectHandle::writeJSON. This test is
    // built for minimal.pdf.

    // Test QPDFObjectHandle::getJSON.
    for (int i = 1; i < 7; ++i) {
        auto oh = pdf.getObject(i, 0);
        Pl_Buffer bf1{"write", nullptr};
        Pl_Buffer bf2{"get", nullptr};
        oh.writeJSON(JSON::LATEST, &bf1, true, 7);
        bf1.finish();
        oh.getJSON(JSON::LATEST, true).write(&bf2, 7);
        bf2.finish();
        assert(bf1.getString() == bf2.getString());
    }

    // Test QPDFObjectHandle::getStreamJSON.
    pdf.getObject(4, 0).getDict().replaceKey("/Test", "42"_qpdf);
    assert(
        pdf.getObject(4, 0)
            .getStreamJSON(JSON::LATEST, qpdf_sj_inline, qpdf_dl_generalized, nullptr, "")
            .unparse() ==
        "{\n"
        "  \"data\": \"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\",\n"
        "  \"dict\": {\n"
        "    \"/Test\": 42\n"
        "  }\n"
        "}");
}